

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O1

void xmlXPtrStringRangeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectType xVar1;
  xmlElementType xVar2;
  int *piVar3;
  xmlChar *pxVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int len;
  int iVar8;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr pxVar9;
  xmlLocationSetPtr pxVar10;
  xmlXPathObjectPtr pxVar11;
  xmlNodePtr pxVar12;
  undefined4 extraout_var;
  xmlChar *pxVar13;
  xmlNodePtr cur;
  xmlNodePtr pxVar14;
  long lVar15;
  int iVar16;
  int startindex;
  xmlNodePtr start;
  int rindx;
  xmlNodePtr rend;
  int local_cc;
  int local_c8;
  xmlChar local_c3;
  char local_c2;
  char local_c1;
  xmlXPathObjectPtr local_c0;
  xmlNodePtr local_b8;
  xmlNodePtr local_b0;
  int local_a4;
  xmlXPathObjectPtr local_a0;
  xmlXPathObjectPtr local_98;
  xmlLocationSetPtr local_90;
  int local_88;
  int local_84;
  ulong local_80;
  xmlXPathParserContextPtr local_78;
  xmlChar *local_70;
  int local_64;
  undefined8 local_60;
  xmlNodePtr local_58;
  xmlXPathObjectPtr local_50;
  int *local_48;
  long local_40;
  xmlChar *local_38;
  
  if (nargs - 5U < 0xfffffffd) {
    xmlXPathErr(ctxt,0xc);
    return;
  }
  if (nargs < 4) {
    local_a0 = (xmlXPathObjectPtr)0x0;
    local_80 = 0;
LAB_001ee5eb:
    local_88 = -1;
    if (nargs < 3) {
LAB_001ee635:
      obj = (xmlXPathObjectPtr)0x0;
    }
    else {
      if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NUMBER)) {
        local_c0 = (xmlXPathObjectPtr)0x0;
        obj = (xmlXPathObjectPtr)0x0;
        goto LAB_001ee6cb;
      }
      obj = valuePop(ctxt);
      if (obj == (xmlXPathObjectPtr)0x0) goto LAB_001ee635;
      local_88 = (int)obj->floatval + -1;
    }
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING)) {
      local_c0 = (xmlXPathObjectPtr)0x0;
      goto LAB_001ee6cb;
    }
    local_c0 = valuePop(ctxt);
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
       ((xVar1 = ctxt->value->type, xVar1 != XPATH_LOCATIONSET && (xVar1 != XPATH_NODESET))))
    goto LAB_001ee6cb;
    pxVar9 = valuePop(ctxt);
    pxVar10 = (xmlLocationSetPtr)(*xmlMalloc)(0x10);
    if (pxVar10 == (xmlLocationSetPtr)0x0) {
      xmlXPtrErrMemory("allocating locationset");
      pxVar10 = (xmlLocationSetPtr)0x0;
    }
    else {
      pxVar10->locNr = 0;
      pxVar10->locMax = 0;
      pxVar10->locTab = (xmlXPathObjectPtr *)0x0;
    }
    if (pxVar10 != (xmlLocationSetPtr)0x0) {
      if (pxVar9->nodesetval != (xmlNodeSetPtr)0x0) {
        pxVar11 = pxVar9;
        local_78 = ctxt;
        if (pxVar9->type == XPATH_NODESET) {
          pxVar11 = xmlXPtrNewLocationSetNodeSet(pxVar9->nodesetval);
          xmlXPathFreeObject(pxVar9);
          if (pxVar11 == (xmlXPathObjectPtr)0x0) {
            xmlXPathErr(local_78,0xf);
            ctxt = local_78;
            goto LAB_001ee6da;
          }
        }
        pxVar9 = pxVar11;
        ctxt = local_78;
        if (0 < *pxVar11->user) {
          local_c1 = 0 < (int)local_80 && local_a0 != (xmlXPathObjectPtr)0x0;
          local_c2 = (int)local_80 < 1 && local_a0 != (xmlXPathObjectPtr)0x0;
          lVar15 = 0;
          local_cc = 0;
          pxVar12 = (xmlNodePtr)0x0;
          local_98 = obj;
          local_90 = pxVar10;
          local_50 = pxVar11;
          local_48 = (int *)pxVar11->user;
          do {
            piVar3 = *(int **)(*(long *)(local_48 + 2) + lVar15 * 8);
            if ((piVar3 != (int *)0x0) && ((*piVar3 == 6 || (*piVar3 == 5)))) {
              local_b0 = *(xmlNodePtr *)(piVar3 + 10);
              local_c8 = piVar3[0xc];
              if (local_c8 < 1) {
                local_c8 = 0;
              }
            }
            piVar3 = *(int **)(*(long *)(local_48 + 2) + lVar15 * 8);
            if ((piVar3 != (int *)0x0) && (*piVar3 - 5U < 2)) {
              pxVar12 = *(xmlNodePtr *)(piVar3 + 10);
              local_cc = piVar3[0xc];
              if (local_cc < 1) {
                local_cc = 0;
              }
            }
            xmlXPtrAdvanceChar(&local_b0,&local_c8,0);
            pxVar9 = local_c0;
            local_b8 = pxVar12;
            local_40 = lVar15;
            if (pxVar12 != (xmlNodePtr)0x0) {
              xVar2 = pxVar12->type;
              if ((xVar2 == XML_ELEMENT_NODE) || (xVar2 == XML_DOCUMENT_NODE)) {
LAB_001ee8dc:
                if (0 < local_cc) {
                  pxVar12 = xmlXPtrGetNthChild(pxVar12,local_cc);
                }
              }
              else {
                if (xVar2 == XML_NAMESPACE_DECL) goto LAB_001ee91c;
                if (xVar2 == XML_HTML_DOCUMENT_NODE) goto LAB_001ee8dc;
              }
              do {
                pxVar14 = pxVar12;
                pxVar9 = local_c0;
                if (pxVar14 == (xmlNodePtr)0x0) goto LAB_001ee91c;
                pxVar12 = pxVar14->last;
              } while (pxVar14->last != (_xmlNode *)0x0);
              if ((pxVar14->type != XML_ELEMENT_NODE) && (pxVar14->content != (xmlChar *)0x0)) {
                local_cc = xmlStrlen(pxVar14->content);
                pxVar9 = local_c0;
                local_b8 = pxVar14;
              }
            }
LAB_001ee91c:
            pxVar4 = pxVar9->stringval;
            if (((pxVar4 != (xmlChar *)0x0) && (local_b0 != (xmlNodePtr)0x0)) &&
               (local_b0->type != XML_NAMESPACE_DECL)) {
              iVar16 = local_c8 + -1;
              local_c3 = *pxVar4;
              pxVar12 = local_b0;
              local_38 = pxVar4;
              do {
                if ((pxVar12->type != XML_ELEMENT_NODE) && (pxVar12->content != (xmlChar *)0x0)) {
                  iVar7 = xmlStrlen(pxVar12->content);
                  local_60 = CONCAT44(extraout_var,iVar7);
                  if (iVar16 <= iVar7) {
                    if (local_c3 == '\0') {
                      iVar7 = iVar16 + 1;
                      bVar5 = true;
                      pxVar14 = pxVar12;
                      local_c8 = iVar7;
                      local_b0 = pxVar12;
                      goto LAB_001ee944;
                    }
                    local_64 = iVar7 + 1;
                    do {
                      pxVar13 = xmlStrchr(pxVar12->content + iVar16,local_c3);
                      pxVar4 = local_38;
                      iVar16 = local_64;
                      if (pxVar13 != (xmlChar *)0x0) {
                        iVar6 = (int)pxVar13 - *(int *)&pxVar12->content;
                        local_a4 = iVar6 + 1;
                        pxVar14 = local_b8;
                        iVar7 = local_cc;
                        if (((pxVar12->type == XML_NAMESPACE_DECL) || (local_b8 == (xmlNodePtr)0x0))
                           || (local_b8->type == XML_NAMESPACE_DECL)) {
LAB_001eebee:
                          bVar5 = true;
                          pxVar9 = local_c0;
                          local_c8 = local_a4;
                          local_b0 = pxVar12;
                          goto LAB_001ee944;
                        }
                        len = xmlStrlen(local_38);
                        local_70 = pxVar4;
                        cur = pxVar12;
                        do {
                          pxVar14 = local_b8;
                          obj = local_98;
                          iVar7 = local_cc;
                          if (len < 1) goto LAB_001eebee;
                          iVar7 = len + iVar6;
                          if ((cur == local_b8) &&
                             (pxVar9 = local_c0, iVar16 = local_a4, local_cc < iVar7)) break;
                          if ((cur->type != XML_ELEMENT_NODE) && (cur->content != (xmlChar *)0x0)) {
                            iVar8 = xmlStrlen(cur->content);
                            pxVar4 = local_70;
                            if (iVar7 <= iVar8) {
                              iVar6 = xmlStrncmp(cur->content + iVar6,local_70,len);
                              pxVar9 = local_c0;
                              pxVar14 = cur;
                              obj = local_98;
                              iVar16 = local_a4;
                              if (iVar6 == 0) goto LAB_001eebee;
                              break;
                            }
                            iVar8 = iVar8 - iVar6;
                            iVar7 = xmlStrncmp(cur->content + iVar6,local_70,iVar8);
                            pxVar9 = local_c0;
                            obj = local_98;
                            iVar16 = local_a4;
                            if (iVar7 != 0) break;
                            local_70 = pxVar4 + iVar8;
                            len = len - iVar8;
                          }
                          iVar6 = 0;
                          cur = xmlXPtrAdvanceNode(cur,(int *)0x0);
                          pxVar9 = local_c0;
                          obj = local_98;
                          iVar16 = local_a4;
                        } while (cur != (xmlNodePtr)0x0);
                      }
                    } while (iVar16 <= (int)local_60);
                  }
                }
                if ((pxVar12 == local_b8) && (local_cc <= iVar16)) break;
                pxVar12 = xmlXPtrAdvanceNode(pxVar12,(int *)0x0);
                iVar16 = 1;
              } while (pxVar12 != (xmlNodePtr)0x0);
            }
            bVar5 = false;
            pxVar14 = local_b8;
            iVar7 = local_cc;
LAB_001ee944:
            if (bVar5) {
              pxVar12 = pxVar14;
              iVar16 = iVar7;
              if (obj == (xmlXPathObjectPtr)0x0) {
LAB_001ee9cc:
                pxVar11 = xmlXPtrNewRange(local_b0,local_c8,pxVar12,iVar16);
                xmlXPtrLocationSetAdd(local_90,pxVar11);
              }
              else {
                iVar6 = xmlXPtrAdvanceChar(&local_b0,&local_c8,local_88);
                if (iVar6 == 0) {
                  if (local_c1 == '\0') {
                    if (local_c2 != '\0') {
                      pxVar12 = local_b0;
                      iVar16 = local_c8;
                    }
                  }
                  else {
                    local_58 = local_b0;
                    local_84 = local_c8 + -1;
                    iVar6 = xmlXPtrAdvanceChar(&local_58,&local_84,(int)local_80);
                    pxVar12 = local_58;
                    iVar16 = local_84;
                    if (iVar6 != 0) goto LAB_001ee9de;
                  }
                  goto LAB_001ee9cc;
                }
              }
LAB_001ee9de:
              local_c8 = iVar7;
              local_b0 = pxVar14;
              if (*pxVar9->stringval == '\0') {
                local_c8 = iVar7 + 1;
              }
              goto LAB_001ee91c;
            }
            lVar15 = local_40 + 1;
            pxVar9 = local_50;
            pxVar12 = local_b8;
            ctxt = local_78;
            pxVar10 = local_90;
          } while (lVar15 < *local_48);
        }
      }
      goto LAB_001ee6da;
    }
    iVar16 = 0xf;
  }
  else {
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (local_80 = 0, ctxt->value->type == XPATH_NUMBER)
       ) {
      local_a0 = valuePop(ctxt);
      if (local_a0 == (xmlXPathObjectPtr)0x0) {
        local_a0 = (xmlXPathObjectPtr)0x0;
      }
      else {
        local_80 = (ulong)(uint)(int)local_a0->floatval;
      }
      goto LAB_001ee5eb;
    }
    local_c0 = (xmlXPathObjectPtr)0x0;
    obj = (xmlXPathObjectPtr)0x0;
    local_a0 = (xmlXPathObjectPtr)0x0;
LAB_001ee6cb:
    iVar16 = 0xb;
    pxVar9 = (xmlXPathObjectPtr)0x0;
  }
  xmlXPathErr(ctxt,iVar16);
  pxVar10 = (xmlLocationSetPtr)0x0;
LAB_001ee6da:
  if (pxVar10 != (xmlLocationSetPtr)0x0) {
    pxVar11 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
    if (pxVar11 == (xmlXPathObjectPtr)0x0) {
      xmlXPtrErrMemory("allocating locationset");
      pxVar11 = (xmlXPathObjectPtr)0x0;
    }
    else {
      *(undefined8 *)pxVar11 = 0;
      pxVar11->nodesetval = (xmlNodeSetPtr)0x0;
      pxVar11->stringval = (xmlChar *)0x0;
      pxVar11->user = (void *)0x0;
      *(undefined8 *)&pxVar11->index = 0;
      pxVar11->user2 = (void *)0x0;
      *(undefined8 *)&pxVar11->boolval = 0;
      pxVar11->floatval = 0.0;
      *(undefined8 *)&pxVar11->index2 = 0;
      pxVar11->type = XPATH_LOCATIONSET;
      pxVar11->user = pxVar10;
    }
    valuePush(ctxt,pxVar11);
  }
  xmlXPathFreeObject(pxVar9);
  xmlXPathFreeObject(local_c0);
  if (obj != (xmlXPathObjectPtr)0x0) {
    xmlXPathFreeObject(obj);
  }
  if (local_a0 != (xmlXPathObjectPtr)0x0) {
    xmlXPathFreeObject(local_a0);
  }
  return;
}

Assistant:

static void
xmlXPtrStringRangeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    int i, startindex, endindex = 0, fendindex;
    xmlNodePtr start, end = 0, fend;
    xmlXPathObjectPtr set = NULL;
    xmlLocationSetPtr oldset;
    xmlLocationSetPtr newset = NULL;
    xmlXPathObjectPtr string = NULL;
    xmlXPathObjectPtr position = NULL;
    xmlXPathObjectPtr number = NULL;
    int found, pos = 0, num = 0;

    /*
     * Grab the arguments
     */
    if ((nargs < 2) || (nargs > 4))
	XP_ERROR(XPATH_INVALID_ARITY);

    if (nargs >= 4) {
        if ((ctxt->value == NULL) || (ctxt->value->type != XPATH_NUMBER)) {
            xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
            goto error;
        }
	number = valuePop(ctxt);
	if (number != NULL)
	    num = (int) number->floatval;
    }
    if (nargs >= 3) {
        if ((ctxt->value == NULL) || (ctxt->value->type != XPATH_NUMBER)) {
            xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
            goto error;
        }
	position = valuePop(ctxt);
	if (position != NULL)
	    pos = (int) position->floatval;
    }
    if ((ctxt->value == NULL) || (ctxt->value->type != XPATH_STRING)) {
        xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
        goto error;
    }
    string = valuePop(ctxt);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET))) {
        xmlXPathErr(ctxt, XPATH_INVALID_TYPE);
        goto error;
    }
    set = valuePop(ctxt);
    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
        xmlXPathErr(ctxt, XPATH_MEMORY_ERROR);
        goto error;
    }
    if (set->nodesetval == NULL) {
        goto error;
    }
    if (set->type == XPATH_NODESET) {
	xmlXPathObjectPtr tmp;

	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(set->nodesetval);
	xmlXPathFreeObject(set);
	if (tmp == NULL) {
            xmlXPathErr(ctxt, XPATH_MEMORY_ERROR);
            goto error;
        }
	set = tmp;
    }
    oldset = (xmlLocationSetPtr) set->user;

    /*
     * The loop is to search for each element in the location set
     * the list of location set corresponding to that search
     */
    for (i = 0;i < oldset->locNr;i++) {
#ifdef DEBUG_RANGES
	xmlXPathDebugDumpObject(stdout, oldset->locTab[i], 0);
#endif

	xmlXPtrGetStartPoint(oldset->locTab[i], &start, &startindex);
	xmlXPtrGetEndPoint(oldset->locTab[i], &end, &endindex);
	xmlXPtrAdvanceChar(&start, &startindex, 0);
	xmlXPtrGetLastChar(&end, &endindex);

#ifdef DEBUG_RANGES
	xmlGenericError(xmlGenericErrorContext,
		"from index %d of ->", startindex);
	xmlDebugDumpString(stdout, start->content);
	xmlGenericError(xmlGenericErrorContext, "\n");
	xmlGenericError(xmlGenericErrorContext,
		"to index %d of ->", endindex);
	xmlDebugDumpString(stdout, end->content);
	xmlGenericError(xmlGenericErrorContext, "\n");
#endif
	do {
            fend = end;
            fendindex = endindex;
	    found = xmlXPtrSearchString(string->stringval, &start, &startindex,
		                        &fend, &fendindex);
	    if (found == 1) {
		if (position == NULL) {
		    xmlXPtrLocationSetAdd(newset,
			 xmlXPtrNewRange(start, startindex, fend, fendindex));
		} else if (xmlXPtrAdvanceChar(&start, &startindex,
			                      pos - 1) == 0) {
		    if ((number != NULL) && (num > 0)) {
			int rindx;
			xmlNodePtr rend;
			rend = start;
			rindx = startindex - 1;
			if (xmlXPtrAdvanceChar(&rend, &rindx,
				               num) == 0) {
			    xmlXPtrLocationSetAdd(newset,
					xmlXPtrNewRange(start, startindex,
							rend, rindx));
			}
		    } else if ((number != NULL) && (num <= 0)) {
			xmlXPtrLocationSetAdd(newset,
				    xmlXPtrNewRange(start, startindex,
						    start, startindex));
		    } else {
			xmlXPtrLocationSetAdd(newset,
				    xmlXPtrNewRange(start, startindex,
						    fend, fendindex));
		    }
		}
		start = fend;
		startindex = fendindex;
		if (string->stringval[0] == 0)
		    startindex++;
	    }
	} while (found == 1);
    }

    /*
     * Save the new value and cleanup
     */
error:
    if (newset != NULL)
        valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
    xmlXPathFreeObject(set);
    xmlXPathFreeObject(string);
    if (position) xmlXPathFreeObject(position);
    if (number) xmlXPathFreeObject(number);
}